

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

cubeb_resampler *
cubeb_resampler_create
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  int *in_RDX;
  int *in_RSI;
  cubeb_sample_format format;
  undefined4 in_stack_00000064;
  undefined4 in_stack_0000006c;
  uint in_stack_00000074;
  cubeb_stream_params *in_stack_00000078;
  cubeb_stream_params *in_stack_00000080;
  cubeb_stream *in_stack_00000088;
  cubeb_resampler_quality in_stack_000000a0;
  cubeb_resampler_reclock in_stack_000000a8;
  undefined4 local_3c;
  undefined8 local_8;
  
  if (in_RSI == (int *)0x0) {
    local_3c = *in_RDX;
  }
  else {
    local_3c = *in_RSI;
  }
  if (local_3c == 0) {
    local_8 = cubeb_resampler_create_internal<short>
                        (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000074,
                         (cubeb_data_callback)CONCAT44(in_stack_0000006c,reclock),
                         (void *)CONCAT44(in_stack_00000064,quality),in_stack_000000a0,
                         in_stack_000000a8);
  }
  else if (local_3c == 2) {
    local_8 = cubeb_resampler_create_internal<float>
                        (in_stack_00000088,in_stack_00000080,in_stack_00000078,in_stack_00000074,
                         (cubeb_data_callback)CONCAT44(in_stack_0000006c,reclock),
                         (void *)CONCAT44(in_stack_00000064,quality),in_stack_000000a0,
                         in_stack_000000a8);
  }
  else {
    local_8 = (cubeb_resampler *)0x0;
  }
  return local_8;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create(cubeb_stream * stream,
                       cubeb_stream_params * input_params,
                       cubeb_stream_params * output_params,
                       unsigned int target_rate, cubeb_data_callback callback,
                       void * user_ptr, cubeb_resampler_quality quality,
                       cubeb_resampler_reclock reclock)
{
  cubeb_sample_format format;

  assert(input_params || output_params);

  if (input_params) {
    format = input_params->format;
  } else {
    format = output_params->format;
  }

  switch (format) {
  case CUBEB_SAMPLE_S16NE:
    return cubeb_resampler_create_internal<short>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  case CUBEB_SAMPLE_FLOAT32NE:
    return cubeb_resampler_create_internal<float>(
        stream, input_params, output_params, target_rate, callback, user_ptr,
        quality, reclock);
  default:
    assert(false);
    return nullptr;
  }
}